

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O3

bool __thiscall google::protobuf::util::Status::operator==(Status *this,Status *x)

{
  size_t __n;
  int iVar1;
  
  if ((this->error_code_ == x->error_code_) &&
     (__n = (this->error_message_)._M_string_length, __n == (x->error_message_)._M_string_length)) {
    if (__n != 0) {
      iVar1 = bcmp((this->error_message_)._M_dataplus._M_p,(x->error_message_)._M_dataplus._M_p,__n)
      ;
      return iVar1 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool Status::operator==(const Status& x) const {
  return error_code_ == x.error_code_ &&
      error_message_ == x.error_message_;
}